

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  string *psVar4;
  string *psVar5;
  cmValue cVar6;
  cmValue cVar7;
  long lVar8;
  bool *pbVar9;
  bool bVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string objectName;
  string relFromBinary;
  string relFromSource;
  string lang;
  RegularExpression var;
  pointer local_1c0;
  string local_1b8;
  bool *local_198;
  string local_190;
  string *local_170;
  string *local_168;
  string local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_110 [3];
  char *local_80;
  char *local_70;
  char *local_60;
  int local_58;
  string local_50;
  
  local_198 = hasSourceExtension;
  local_170 = dir_max;
  psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  psVar4 = cmake::GetHomeDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)local_120,&(this->super_cmOutputConverter).StateSnapshot);
  psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_120);
  anon_unknown.dwarf_1a1f903::relativeIfUnder(&local_160,psVar4,psVar5,psVar3);
  if (local_160._M_string_length == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xec4,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&local_160);
  local_168 = __return_storage_ptr__;
  psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)local_120,&(this->super_cmOutputConverter).StateSnapshot);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_120);
  anon_unknown.dwarf_1a1f903::relativeIfUnder(&local_190,psVar4,psVar5,psVar3);
  if (local_190._M_string_length == 0) {
    __assert_fail("!relFromBinary.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xecb,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&local_190);
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_assign((string *)&local_1b8);
  psVar3 = local_168;
  bVar2 = cmsys::SystemTools::FileIsFullPath(&local_1b8);
  if ((bVar2) && (bVar2 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance), bVar2)) {
    psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    cmsys::SystemTools::GetFilenameName((string *)local_120,psVar4);
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_120);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ != local_110)
    {
      operator_delete((void *)local_120._0_8_,
                      (ulong)((long)local_110[0].Data.
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  local_120._0_8_ = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"UNITY_SOURCE_FILE","");
  cVar6 = cmSourceFile::GetProperty(source,(string *)local_120);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ != local_110) {
    operator_delete((void *)local_120._0_8_,
                    (ulong)((long)local_110[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  local_120._0_8_ = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"PCH_EXTENSION","");
  cVar7 = cmSourceFile::GetProperty(source,(string *)local_120);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ != local_110) {
    operator_delete((void *)local_120._0_8_,
                    (ulong)((long)local_110[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  lVar8 = std::__cxx11::string::find((char *)&local_1b8,0x7c0b9a,0);
  local_1c0 = customOutputExtension;
  if (((cVar6.Value != (string *)0x0) || (cVar7.Value != (string *)0x0)) || (lVar8 != -1)) {
    if (cVar7.Value != (string *)0x0) {
      local_1c0 = ((cVar7.Value)->_M_dataplus)._M_p;
    }
    local_70 = (char *)0x0;
    local_60 = (char *)0x0;
    local_58 = 0;
    memset((RegularExpression *)local_120,0,0xaa);
    cmsys::RegularExpression::compile((RegularExpression *)local_120,"(CMakeFiles/[^/]+.dir/)");
    bVar2 = cmsys::RegularExpression::find
                      ((RegularExpression *)local_120,local_1b8._M_dataplus._M_p,
                       (RegularExpressionMatch *)local_120);
    if (bVar2) {
      std::__cxx11::string::erase((ulong)&local_1b8,local_120._0_8_ - (long)local_80);
    }
    if (local_60 != (char *)0x0) {
      operator_delete__(local_60);
    }
  }
  local_120._0_8_ = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"KEEP_EXTENSION","");
  bVar2 = cmSourceFile::GetPropertyAsBool(source,(string *)local_120);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ != local_110) {
    operator_delete((void *)local_120._0_8_,
                    (ulong)((long)local_110[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  pbVar9 = local_198;
  bVar10 = true;
  if (bVar2) goto LAB_00452433;
  bVar2 = NeedBackwardsCompatibility_2_4(this);
  if (bVar2) {
LAB_0045235a:
    lVar8 = std::__cxx11::string::rfind((char)&local_1b8,0x2e);
    if (lVar8 != -1) {
      std::__cxx11::string::substr((ulong)local_120,(ulong)&local_1b8);
      std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_120);
      pbVar9 = local_198;
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ != local_110
         ) {
        operator_delete((void *)local_120._0_8_,
                        (ulong)((long)local_110[0].Data.
                                      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
        pbVar9 = local_198;
      }
    }
    if (local_1c0 != (pointer)0x0) {
      std::__cxx11::string::append((char *)&local_1b8);
      bVar10 = false;
      goto LAB_00452433;
    }
    bVar10 = false;
  }
  else {
    cmSourceFile::GetLanguage_abi_cxx11_((string *)local_140,source);
    if ((cmState *)local_140._8_8_ == (cmState *)0x0) {
      bVar2 = false;
    }
    else {
      this_00 = this->Makefile;
      local_120._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x6;
      local_120._8_8_ = "CMAKE_";
      local_110[0].Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_140._8_8_;
      local_110[0].Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_140._0_8_;
      local_110[0].Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x19;
      local_110[0].UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x7c8396;
      views._M_len = 3;
      views._M_array = (iterator)local_120;
      cmCatViews_abi_cxx11_(&local_50,views);
      bVar2 = cmMakefile::IsOn(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_140._0_8_ !=
        (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_140 + 0x10)) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    bVar10 = true;
    pbVar9 = local_198;
    if ((bVar2 | local_1c0 != (pointer)0x0) == 1) goto LAB_0045235a;
  }
  cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
            ((string *)local_120,this->GlobalGenerator,source);
  std::__cxx11::string::_M_append((char *)&local_1b8,local_120._0_8_);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ != local_110) {
    operator_delete((void *)local_120._0_8_,
                    (ulong)((long)local_110[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
LAB_00452433:
  if (pbVar9 != (bool *)0x0) {
    *pbVar9 = bVar10;
  }
  psVar4 = CreateSafeUniqueObjectFileName(this,&local_1b8,local_170);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar3,pcVar1,pcVar1 + psVar4->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                             local_1b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  return psVar3;
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource = relativeIfUnder(
    this->GetSourceDirectory(), this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource);
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary = relativeIfUnder(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary);
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
  // NOLINTNEXTLINE(bugprone-branch-clone)
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource) ||
             relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName)) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Ensure that for the CMakeFiles/<target>.dir/generated_source_file
  // we don't end up having:
  // CMakeFiles/<target>.dir/CMakeFiles/<target>.dir/generated_source_file.obj
  cmValue unitySourceFile = source.GetProperty("UNITY_SOURCE_FILE");
  cmValue pchExtension = source.GetProperty("PCH_EXTENSION");
  const bool isPchObject = objectName.find("cmake_pch") != std::string::npos;
  if (unitySourceFile || pchExtension || isPchObject) {
    if (pchExtension) {
      customOutputExtension = pchExtension->c_str();
    }

    cmsys::RegularExpression var("(CMakeFiles/[^/]+.dir/)");
    if (var.find(objectName)) {
      objectName.erase(var.start(), var.end() - var.start());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        replaceExt = this->Makefile->IsOn(
          cmStrCat("CMAKE_", lang, "_OUTPUT_EXTENSION_REPLACE"));
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}